

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

xpath_ast_node * __thiscall
pugi::impl::anon_unknown_0::xpath_parser::parse_step(xpath_parser *this,xpath_ast_node *set)

{
  xpath_lexer_string *pxVar1;
  byte bVar2;
  lexeme_t lVar3;
  lexeme_t lVar4;
  xpath_allocator *__src;
  bool bVar5;
  bool bVar6;
  nodetest_t nVar7;
  char_t *__dest;
  xpath_ast_node *pxVar8;
  xpath_ast_node *pxVar9;
  xpath_ast_node *pxVar10;
  xpath_parse_result *pxVar11;
  undefined4 uVar12;
  size_t __n;
  xpath_ast_node *pxVar13;
  char *pcVar14;
  char *pcVar15;
  xpath_lexer *pxVar16;
  xpath_allocator *local_58;
  char_t *pcStack_50;
  xpath_lexer *local_40;
  undefined4 local_34;
  
  if ((set == (xpath_ast_node *)0x0) || (set->_rettype == '\x01')) {
    pxVar16 = &this->_lexer;
    lVar3 = (this->_lexer)._cur_lexeme;
    if (lVar3 == lex_double_dot) {
      xpath_lexer::next(pxVar16);
      if ((this->_lexer)._cur_lexeme != lex_open_square_brace) {
        pxVar8 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
        if (pxVar8 == (xpath_ast_node *)0x0) {
          return (xpath_ast_node *)0x0;
        }
        pxVar8->_type = '8';
        pxVar8->_rettype = '\x01';
        pxVar8->_axis = '\t';
        pxVar8->_test = '\x02';
LAB_001139f0:
        pxVar8->_left = set;
        pxVar8->_right = (xpath_ast_node *)0x0;
        pxVar8->_next = (xpath_ast_node *)0x0;
        (pxVar8->_data).string = (char_t *)0x0;
        return pxVar8;
      }
    }
    else {
      if (lVar3 != lex_dot) {
        pcVar14 = &set->_type;
        if (lVar3 != lex_axis_attribute) {
          local_34 = 3;
        }
        else {
          xpath_lexer::next(pxVar16);
          local_34 = 2;
        }
        local_58 = (xpath_allocator *)0x0;
        pcStack_50 = (char_t *)0x0;
        lVar4 = (this->_lexer)._cur_lexeme;
        local_40 = pxVar16;
        if (lVar4 == lex_multiply) {
          xpath_lexer::next(pxVar16);
          nVar7 = nodetest_all;
          goto LAB_00113a65;
        }
        pcVar15 = "Unrecognized node test";
        if (lVar4 == lex_string) {
          pxVar1 = &(this->_lexer)._cur_lexeme_contents;
          local_58 = (xpath_allocator *)(this->_lexer)._cur_lexeme_contents.begin;
          pcStack_50 = (this->_lexer)._cur_lexeme_contents.end;
          xpath_lexer::next(pxVar16);
          if ((this->_lexer)._cur_lexeme == lex_double_colon) {
            if (lVar3 == lex_axis_attribute) {
              pcVar15 = "Two axis specifiers in one step";
              goto LAB_00113e42;
            }
            bVar2 = *(byte *)&local_58->_root;
            if (bVar2 < 0x6e) {
              switch(bVar2) {
              case 0x61:
                pcVar14 = "ancestor";
                bVar6 = xpath_lexer_string::operator==
                                  ((xpath_lexer_string *)&stack0xffffffffffffffa8,
                                   (char_t *)"ancestor");
                uVar12 = 0;
                bVar5 = true;
                if (!bVar6) {
                  pcVar14 = "ancestor-or-self";
                  bVar6 = xpath_lexer_string::operator==
                                    ((xpath_lexer_string *)&stack0xffffffffffffffa8,
                                     (char_t *)"ancestor-or-self");
                  uVar12 = 1;
                  if (!bVar6) {
                    pcVar14 = "attribute";
                    bVar6 = xpath_lexer_string::operator==
                                      ((xpath_lexer_string *)&stack0xffffffffffffffa8,"attribute");
                    uVar12 = 2;
                    goto LAB_00113dfd;
                  }
                }
                break;
              default:
                goto switchD_00113be8_caseD_62;
              case 99:
                pcVar14 = "child";
                bVar5 = xpath_lexer_string::operator==
                                  ((xpath_lexer_string *)&stack0xffffffffffffffa8,"child");
                if (!bVar5) goto switchD_00113be8_caseD_62;
                uVar12 = 3;
LAB_00113db1:
                bVar5 = true;
                break;
              case 100:
                pcVar14 = "descendant";
                bVar6 = xpath_lexer_string::operator==
                                  ((xpath_lexer_string *)&stack0xffffffffffffffa8,
                                   (char_t *)"descendant");
                uVar12 = 4;
                bVar5 = true;
                if (!bVar6) {
                  pcVar14 = "descendant-or-self";
                  bVar6 = xpath_lexer_string::operator==
                                    ((xpath_lexer_string *)&stack0xffffffffffffffa8,
                                     (char_t *)"descendant-or-self");
                  uVar12 = 5;
LAB_00113dfd:
                  bVar5 = true;
                  if (bVar6 == false) goto switchD_00113be8_caseD_62;
                }
                break;
              case 0x66:
                pcVar14 = "following";
                bVar6 = xpath_lexer_string::operator==
                                  ((xpath_lexer_string *)&stack0xffffffffffffffa8,
                                   (char_t *)"following");
                uVar12 = 6;
                bVar5 = true;
                if (!bVar6) {
                  pcVar14 = "following-sibling";
                  bVar6 = xpath_lexer_string::operator==
                                    ((xpath_lexer_string *)&stack0xffffffffffffffa8,
                                     (char_t *)"following-sibling");
                  uVar12 = 7;
                  goto LAB_00113dfd;
                }
              }
            }
            else {
              if (bVar2 == 0x6e) {
                pcVar14 = "namespace";
                bVar5 = xpath_lexer_string::operator==
                                  ((xpath_lexer_string *)&stack0xffffffffffffffa8,
                                   (char_t *)"namespace");
                if (bVar5) {
                  uVar12 = 8;
                  goto LAB_00113db1;
                }
              }
              else {
                if (bVar2 == 0x70) {
                  pcVar14 = "parent";
                  bVar6 = xpath_lexer_string::operator==
                                    ((xpath_lexer_string *)&stack0xffffffffffffffa8,"parent");
                  uVar12 = 9;
                  bVar5 = true;
                  if (!bVar6) {
                    pcVar14 = "preceding";
                    bVar6 = xpath_lexer_string::operator==
                                      ((xpath_lexer_string *)&stack0xffffffffffffffa8,
                                       (char_t *)"preceding");
                    uVar12 = 10;
                    if (!bVar6) {
                      pcVar14 = "preceding-sibling";
                      bVar6 = xpath_lexer_string::operator==
                                        ((xpath_lexer_string *)&stack0xffffffffffffffa8,
                                         (char_t *)"preceding-sibling");
                      uVar12 = 0xb;
                      goto LAB_00113dfd;
                    }
                  }
                  goto LAB_00113e08;
                }
                if (bVar2 == 0x73) {
                  pcVar14 = "self";
                  bVar5 = xpath_lexer_string::operator==
                                    ((xpath_lexer_string *)&stack0xffffffffffffffa8,"self");
                  if (bVar5) {
                    uVar12 = 0xc;
                    goto LAB_00113db1;
                  }
                }
              }
switchD_00113be8_caseD_62:
              uVar12 = 3;
              bVar5 = false;
            }
LAB_00113e08:
            if (!bVar5) {
              pcVar15 = "Unknown axis";
              goto LAB_00113e42;
            }
            local_34 = uVar12;
            xpath_lexer::next(local_40);
            pxVar16 = local_40;
            lVar3 = (this->_lexer)._cur_lexeme;
            if (lVar3 == lex_string) {
              local_58 = (xpath_allocator *)pxVar1->begin;
              pcStack_50 = (this->_lexer)._cur_lexeme_contents.end;
              nVar7 = nodetest_none;
              bVar5 = true;
            }
            else {
              if (lVar3 != lex_multiply) goto LAB_00113e42;
              local_58 = (xpath_allocator *)0x0;
              pcStack_50 = (char_t *)0x0;
              nVar7 = nodetest_all;
              bVar5 = false;
            }
            xpath_lexer::next(local_40);
          }
          else {
            nVar7 = nodetest_none;
            bVar5 = true;
            pxVar16 = local_40;
          }
          if (!bVar5) {
LAB_00113a65:
            __src = local_58;
            if (local_58 == (xpath_allocator *)0x0) {
              __dest = "";
            }
            else {
              __n = (long)pcStack_50 - (long)local_58;
              __dest = (char_t *)xpath_allocator::allocate(this->_alloc,__n + 1);
              if (__dest == (char_t *)0x0) {
                __dest = (char_t *)0x0;
              }
              else {
                memcpy(__dest,__src,__n);
                __dest[__n] = '\0';
              }
            }
            if (__dest == (char_t *)0x0) {
              return (xpath_ast_node *)0x0;
            }
            pxVar8 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
            if (pxVar8 == (xpath_ast_node *)0x0) {
              pxVar8 = (xpath_ast_node *)0x0;
            }
            else {
              pxVar8->_type = '8';
              pxVar8->_rettype = '\x01';
              pxVar8->_axis = (char)local_34;
              pxVar8->_test = (char)nVar7;
              pxVar8->_left = set;
              pxVar8->_right = (xpath_ast_node *)0x0;
              pxVar8->_next = (xpath_ast_node *)0x0;
              (pxVar8->_data).string = __dest;
            }
            if (pxVar8 == (xpath_ast_node *)0x0) {
              return (xpath_ast_node *)0x0;
            }
            pxVar13 = (xpath_ast_node *)0x0;
            pxVar16 = local_40;
            do {
              if ((this->_lexer)._cur_lexeme != lex_open_square_brace) {
                return pxVar8;
              }
              xpath_lexer::next(pxVar16);
              bVar5 = false;
              pxVar9 = parse_expression(this,0);
              pxVar16 = local_40;
              if (pxVar9 != (xpath_ast_node *)0x0) {
                pxVar10 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
                pxVar16 = local_40;
                if (pxVar10 == (xpath_ast_node *)0x0) {
                  pxVar10 = (xpath_ast_node *)0x0;
                }
                else {
                  pxVar10->_type = '\x10';
                  pxVar10->_rettype = '\x01';
                  pxVar10->_axis = '\0';
                  pxVar10->_test = '\0';
                  pxVar10->_left = (xpath_ast_node *)0x0;
                  pxVar10->_right = pxVar9;
                  pxVar10->_next = (xpath_ast_node *)0x0;
                }
                if (pxVar10 != (xpath_ast_node *)0x0) {
                  if ((this->_lexer)._cur_lexeme == lex_close_square_brace) {
                    xpath_lexer::next(local_40);
                    if (pxVar13 == (xpath_ast_node *)0x0) {
                      pxVar8->_right = pxVar10;
                    }
                    else {
                      pxVar13->_next = pxVar10;
                    }
                    bVar5 = true;
                    pxVar13 = pxVar10;
                    goto LAB_00113bb0;
                  }
                  pxVar11 = this->_result;
                  pxVar11->error = "Expected \']\' to match an opening \'[\'";
                  pxVar11->offset = (long)(this->_lexer)._cur_lexeme_pos - (long)this->_query;
                }
                bVar5 = false;
              }
LAB_00113bb0:
              if (!bVar5) {
                return (xpath_ast_node *)0x0;
              }
            } while( true );
          }
          if ((this->_lexer)._cur_lexeme != lex_open_brace) {
            nVar7 = nodetest_name;
            if (((2 < (long)pcStack_50 - (long)local_58) && (pcStack_50[-2] == ':')) &&
               (pcStack_50[-1] == '*')) {
              pcStack_50 = pcStack_50 + -1;
              nVar7 = nodetest_all_in_namespace;
            }
            goto LAB_00113a65;
          }
          xpath_lexer::next(pxVar16);
          lVar3 = (this->_lexer)._cur_lexeme;
          if (lVar3 == lex_close_brace) {
            xpath_lexer::next(pxVar16);
            nVar7 = parse_node_test_type
                              ((xpath_parser *)&stack0xffffffffffffffa8,
                               (xpath_lexer_string *)pcVar14);
            if (nVar7 != nodetest_none) {
              local_58 = (xpath_allocator *)0x0;
              pcStack_50 = (char_t *)0x0;
              goto LAB_00113a65;
            }
            pcVar15 = "Unrecognized node type";
          }
          else {
            bVar5 = xpath_lexer_string::operator==
                              ((xpath_lexer_string *)&stack0xffffffffffffffa8,
                               (char_t *)"processing-instruction");
            if (bVar5) {
              if (lVar3 == lex_quoted_string) {
                local_58 = (xpath_allocator *)pxVar1->begin;
                pcStack_50 = (this->_lexer)._cur_lexeme_contents.end;
                xpath_lexer::next(pxVar16);
                if ((this->_lexer)._cur_lexeme == lex_close_brace) {
                  xpath_lexer::next(pxVar16);
                  nVar7 = nodetest_pi;
                  goto LAB_00113a65;
                }
                pcVar15 = "Unmatched brace near processing-instruction()";
              }
              else {
                pcVar15 = "Only literals are allowed as arguments to processing-instruction()";
              }
            }
            else {
              pcVar15 = "Unmatched brace near node type test";
            }
          }
        }
LAB_00113e42:
        pxVar11 = this->_result;
        pxVar11->error = pcVar15;
        goto LAB_00113e49;
      }
      xpath_lexer::next(pxVar16);
      if ((this->_lexer)._cur_lexeme != lex_open_square_brace) {
        pxVar8 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
        if (pxVar8 == (xpath_ast_node *)0x0) {
          return (xpath_ast_node *)0x0;
        }
        pxVar8->_type = '8';
        pxVar8->_rettype = '\x01';
        pxVar8->_axis = '\f';
        pxVar8->_test = '\x02';
        goto LAB_001139f0;
      }
    }
    pxVar11 = this->_result;
    pcVar14 = "Predicates are not allowed after an abbreviated step";
  }
  else {
    pxVar11 = this->_result;
    pcVar14 = "Step has to be applied to node set";
  }
  pxVar11->error = pcVar14;
LAB_00113e49:
  pxVar11->offset = (long)(this->_lexer)._cur_lexeme_pos - (long)this->_query;
  return (xpath_ast_node *)0x0;
}

Assistant:

xpath_ast_node* parse_step(xpath_ast_node* set)
		{
			if (set && set->rettype() != xpath_type_node_set)
				return error("Step has to be applied to node set");

			bool axis_specified = false;
			axis_t axis = axis_child; // implied child axis

			if (_lexer.current() == lex_axis_attribute)
			{
				axis = axis_attribute;
				axis_specified = true;

				_lexer.next();
			}
			else if (_lexer.current() == lex_dot)
			{
				_lexer.next();

				if (_lexer.current() == lex_open_square_brace)
					return error("Predicates are not allowed after an abbreviated step");

				return alloc_node(ast_step, set, axis_self, nodetest_type_node, 0);
			}
			else if (_lexer.current() == lex_double_dot)
			{
				_lexer.next();

				if (_lexer.current() == lex_open_square_brace)
					return error("Predicates are not allowed after an abbreviated step");

				return alloc_node(ast_step, set, axis_parent, nodetest_type_node, 0);
			}

			nodetest_t nt_type = nodetest_none;
			xpath_lexer_string nt_name;

			if (_lexer.current() == lex_string)
			{
				// node name test
				nt_name = _lexer.contents();
				_lexer.next();

				// was it an axis name?
				if (_lexer.current() == lex_double_colon)
				{
					// parse axis name
					if (axis_specified)
						return error("Two axis specifiers in one step");

					axis = parse_axis_name(nt_name, axis_specified);

					if (!axis_specified)
						return error("Unknown axis");

					// read actual node test
					_lexer.next();

					if (_lexer.current() == lex_multiply)
					{
						nt_type = nodetest_all;
						nt_name = xpath_lexer_string();
						_lexer.next();
					}
					else if (_lexer.current() == lex_string)
					{
						nt_name = _lexer.contents();
						_lexer.next();
					}
					else
					{
						return error("Unrecognized node test");
					}
				}

				if (nt_type == nodetest_none)
				{
					// node type test or processing-instruction
					if (_lexer.current() == lex_open_brace)
					{
						_lexer.next();

						if (_lexer.current() == lex_close_brace)
						{
							_lexer.next();

							nt_type = parse_node_test_type(nt_name);

							if (nt_type == nodetest_none)
								return error("Unrecognized node type");

							nt_name = xpath_lexer_string();
						}
						else if (nt_name == PUGIXML_TEXT("processing-instruction"))
						{
							if (_lexer.current() != lex_quoted_string)
								return error("Only literals are allowed as arguments to processing-instruction()");

							nt_type = nodetest_pi;
							nt_name = _lexer.contents();
							_lexer.next();

							if (_lexer.current() != lex_close_brace)
								return error("Unmatched brace near processing-instruction()");
							_lexer.next();
						}
						else
						{
							return error("Unmatched brace near node type test");
						}
					}
					// QName or NCName:*
					else
					{
						if (nt_name.end - nt_name.begin > 2 && nt_name.end[-2] == ':' && nt_name.end[-1] == '*') // NCName:*
						{
							nt_name.end--; // erase *

							nt_type = nodetest_all_in_namespace;
						}
						else
						{
							nt_type = nodetest_name;
						}
					}
				}
			}
			else if (_lexer.current() == lex_multiply)
			{
				nt_type = nodetest_all;
				_lexer.next();
			}
			else
			{
				return error("Unrecognized node test");
			}

			const char_t* nt_name_copy = alloc_string(nt_name);
			if (!nt_name_copy) return 0;

			xpath_ast_node* n = alloc_node(ast_step, set, axis, nt_type, nt_name_copy);
			if (!n) return 0;

			xpath_ast_node* last = 0;

			while (_lexer.current() == lex_open_square_brace)
			{
				_lexer.next();

				xpath_ast_node* expr = parse_expression();
				if (!expr) return 0;

				xpath_ast_node* pred = alloc_node(ast_predicate, 0, expr, predicate_default);
				if (!pred) return 0;

				if (_lexer.current() != lex_close_square_brace)
					return error("Expected ']' to match an opening '['");
				_lexer.next();

				if (last) last->set_next(pred);
				else n->set_right(pred);

				last = pred;
			}

			return n;
		}